

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O2

int IFN_End_Of_Line(FORM *form)

{
  FIELD *pFVar1;
  char *pcVar2;
  char *buf;
  
  pFVar1 = form->current;
  Synchronize_Buffer(form);
  buf = form->current->buf + (long)form->currow * (long)form->current->dcols;
  pcVar2 = After_End_Of_Data(buf,pFVar1->dcols);
  Adjust_Cursor_Position(form,pcVar2 + -(ulong)(pcVar2 == buf + pFVar1->dcols));
  return 0;
}

Assistant:

static int IFN_End_Of_Line(FORM * form)
{
  FIELD *field = form->current;
  char *pos;
  char *bp;

  Synchronize_Buffer(form);
  bp  = Address_Of_Current_Row_In_Buffer(form); 
  pos = After_End_Of_Data(bp,field->dcols);
  if (pos == (bp + field->dcols))
    pos--;
  Adjust_Cursor_Position(form,pos);
  return(E_OK);
}